

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

void __thiscall FFlagCVar::SetGenericRepDefault(FFlagCVar *this,UCVarValue value,ECVarType type)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  undefined4 extraout_var;
  ECVarType dummy;
  undefined1 local_14 [4];
  
  bVar2 = FBaseCVar::ToBool(value,type);
  uVar3 = (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[7])(this->ValueVar,local_14);
  uVar1 = this->BitVal | uVar3;
  if (!bVar2) {
    uVar1 = ~this->BitVal & uVar3;
  }
  (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[8])
            (this->ValueVar,CONCAT44(extraout_var,uVar1),1);
  return;
}

Assistant:

void FFlagCVar::SetGenericRepDefault (UCVarValue value, ECVarType type)
{
	bool newdef = ToBool (value, type);
	ECVarType dummy;
	UCVarValue def;
	def = ValueVar.GetFavoriteRepDefault (&dummy);
	if (newdef)
		def.Int |= BitVal;
	else
		def.Int &= ~BitVal;
	ValueVar.SetGenericRepDefault (def, CVAR_Int);
}